

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

void prune_4_way_partition_search
               (AV1_COMP *cpi,MACROBLOCK *x,PC_TREE *pc_tree,PartitionSearchState *part_search_state
               ,RD_STATS *best_rdc,int pb_source_variance,int prune_ext_part_state,
               int *part4_search_allowed)

{
  _Bool _Var1;
  BLOCK_SIZE BVar2;
  uint uVar3;
  long in_RCX;
  char *in_RDX;
  long in_RSI;
  long in_RDI;
  long in_R8;
  bool bVar4;
  int in_stack_00000008;
  PART4_TYPES i;
  PartitionCfg *part_cfg;
  PARTITION_TYPE cur_part [2];
  _Bool partition4_allowed;
  BLOCK_SIZE part4_bsize_thresh;
  BLOCK_SIZE bsize;
  PartitionBlkParams blk_params;
  int *in_stack_000001b0;
  PartitionSearchState *in_stack_000001b8;
  int64_t in_stack_000001c0;
  int in_stack_000001cc;
  MACROBLOCK *in_stack_000001d0;
  AV1_COMP *in_stack_000001d8;
  uint in_stack_00000200;
  bool local_6e;
  bool local_6d;
  bool local_6c;
  PARTITION_TYPE partition;
  BLOCK_SIZE bsize_00;
  byte local_69;
  BLOCK_SIZE local_5a;
  int *in_stack_ffffffffffffffa8;
  PartitionSearchState *in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  BLOCK_SIZE local_30;
  
  memcpy(&stack0xffffffffffffffa8,(void *)(in_RCX + 8),0x2c);
  if (*(long *)(in_R8 + 0x10) != 0x7fffffffffffffff) {
    local_5a = *(BLOCK_SIZE *)(in_RDI + 0x609ac);
    if (((*(int *)(in_RDI + 0x609b0) != 0) && (*(int *)(in_RSI + 0x18c0c) == 0)) &&
       (*in_RDX == '\0')) {
      local_5a = BLOCK_128X128;
    }
    bsize_00 = BLOCK_4X4;
    if ((*(int *)(in_RCX + 0x128) != 0) && (bsize_00 = BLOCK_4X4, local_5a < local_30)) {
      _Var1 = av1_blk_has_rows_and_cols((PartitionBlkParams *)&stack0xffffffffffffffa8);
      bsize_00 = BLOCK_4X4;
      if (_Var1) {
        bsize_00 = in_stack_00000008 != 0 ^ BLOCK_INVALID;
      }
    }
    if (in_stack_ffffffffffffffbc <
        in_stack_ffffffffffffffc0 << ((byte)*(undefined4 *)(in_RDI + 0x60958) & 0x1f)) {
      part_cfg->enable_rect_partitions = false;
      part_cfg->enable_ab_partitions = false;
      part_cfg->enable_1to4_partitions = false;
      part_cfg->min_partition_size = BLOCK_4X4;
      *(undefined4 *)&part_cfg->max_partition_size = 0;
    }
    else {
      partition = (*(byte *)(in_RDI + 0x42700) & 1) != 0 && local_30 != BLOCK_128X128;
      bVar4 = (bsize_00 & BLOCK_4X8 & partition) != BLOCK_4X4;
      for (local_69 = 0; local_69 < 2; local_69 = local_69 + 1) {
        local_6c = false;
        if ((bVar4) && (local_6c = false, *(int *)(in_RCX + 0x120 + (ulong)local_69 * 4) != 0)) {
          BVar2 = get_partition_subsize(bsize_00,partition);
          BVar2 = get_plane_block_size(BVar2,*(int *)(in_RCX + 0x138),*(int *)(in_RCX + 0x13c));
          local_6c = BVar2 != BLOCK_INVALID;
        }
        *(uint *)(&part_cfg->enable_rect_partitions + (ulong)local_69 * 4) = (uint)local_6c;
      }
      if (*(int *)(in_RDI + 0x60954) == 2) {
        local_6d = true;
        if ((((*in_RDX != '\x01') && (local_6d = true, *in_RDX != '\x04')) &&
            (local_6d = true, *in_RDX != '\x05')) && (local_6d = true, *in_RDX != '\x03')) {
          local_6d = *in_RDX == '\0';
        }
        uVar3._0_1_ = part_cfg->enable_rect_partitions;
        uVar3._1_1_ = part_cfg->enable_ab_partitions;
        uVar3._2_1_ = part_cfg->enable_1to4_partitions;
        uVar3._3_1_ = part_cfg->min_partition_size;
        uVar3 = local_6d & uVar3;
        part_cfg->enable_rect_partitions = (_Bool)(char)uVar3;
        part_cfg->enable_ab_partitions = (_Bool)(char)(uVar3 >> 8);
        part_cfg->enable_1to4_partitions = (_Bool)(char)(uVar3 >> 0x10);
        part_cfg->min_partition_size = (char)(uVar3 >> 0x18);
        local_6e = true;
        if (((*in_RDX != '\x02') && (local_6e = true, *in_RDX != '\x06')) &&
           ((local_6e = true, *in_RDX != '\a' && (local_6e = true, *in_RDX != '\x03')))) {
          local_6e = *in_RDX == '\0';
        }
        *(uint *)&part_cfg->max_partition_size =
             (uint)local_6e & *(uint *)&part_cfg->max_partition_size;
      }
      if (((*(int *)(in_RDI + 0x6095c) != 0) && (bVar4)) &&
         ((*(int *)(in_RCX + 0x120) != 0 && (*(int *)(in_RCX + 0x124) != 0)))) {
        av1_ml_prune_4_partition
                  (in_stack_000001d8,in_stack_000001d0,in_stack_000001cc,in_stack_000001c0,
                   in_stack_000001b8,in_stack_000001b0,in_stack_00000200);
      }
      prune_4_partition_using_split_info
                ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (MACROBLOCK *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                 in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
    }
  }
  return;
}

Assistant:

static void prune_4_way_partition_search(
    AV1_COMP *const cpi, MACROBLOCK *x, PC_TREE *pc_tree,
    PartitionSearchState *part_search_state, RD_STATS *best_rdc,
    int pb_source_variance, int prune_ext_part_state,
    int part4_search_allowed[NUM_PART4_TYPES]) {
  const PartitionBlkParams blk_params = part_search_state->part_blk_params;
  const BLOCK_SIZE bsize = blk_params.bsize;

  // Do not prune if there is no valid partition
  if (best_rdc->rdcost == INT64_MAX) return;

  // Determine bsize threshold to evaluate 4-way partitions
  BLOCK_SIZE part4_bsize_thresh = cpi->sf.part_sf.ext_partition_eval_thresh;
  if (cpi->sf.part_sf.ext_part_eval_based_on_cur_best &&
      !x->must_find_valid_partition && pc_tree->partitioning == PARTITION_NONE)
    part4_bsize_thresh = BLOCK_128X128;

  // 4-way partitions are only allowed for BLOCK_16X16, BLOCK_32X32, and
  // BLOCK_64X64, so part4_bsize_thresh must be large enough to exclude
  // BLOCK_4X4 and BLOCK_8X8.
  assert(part4_bsize_thresh >= BLOCK_8X8);

  bool partition4_allowed =
      part_search_state->do_rectangular_split && bsize > part4_bsize_thresh &&
      av1_blk_has_rows_and_cols(&blk_params) && !prune_ext_part_state;

  // Disable 4-way partition search flags for width less than a multiple of the
  // minimum partition width.
  if (blk_params.width < (blk_params.min_partition_size_1d
                          << cpi->sf.part_sf.prune_part4_search)) {
    part4_search_allowed[HORZ4] = 0;
    part4_search_allowed[VERT4] = 0;
    return;
  }

  PARTITION_TYPE cur_part[NUM_PART4_TYPES] = { PARTITION_HORZ_4,
                                               PARTITION_VERT_4 };
  const PartitionCfg *const part_cfg = &cpi->oxcf.part_cfg;
  // partition4_allowed is 1 if we can use a PARTITION_HORZ_4 or
  // PARTITION_VERT_4 for this block. This is almost the same as
  // partition4_allowed, except that we don't allow 128x32 or 32x128
  // blocks, so we require that bsize is not BLOCK_128X128.
  partition4_allowed &=
      part_cfg->enable_1to4_partitions && bsize != BLOCK_128X128;

  for (PART4_TYPES i = HORZ4; i < NUM_PART4_TYPES; i++) {
    part4_search_allowed[i] =
        partition4_allowed && part_search_state->partition_rect_allowed[i] &&
        get_plane_block_size(get_partition_subsize(bsize, cur_part[i]),
                             part_search_state->ss_x,
                             part_search_state->ss_y) != BLOCK_INVALID;
  }
  // Pruning: pruning out 4-way partitions based on the current best partition.
  if (cpi->sf.part_sf.prune_ext_partition_types_search_level == 2) {
    part4_search_allowed[HORZ4] &= (pc_tree->partitioning == PARTITION_HORZ ||
                                    pc_tree->partitioning == PARTITION_HORZ_A ||
                                    pc_tree->partitioning == PARTITION_HORZ_B ||
                                    pc_tree->partitioning == PARTITION_SPLIT ||
                                    pc_tree->partitioning == PARTITION_NONE);
    part4_search_allowed[VERT4] &= (pc_tree->partitioning == PARTITION_VERT ||
                                    pc_tree->partitioning == PARTITION_VERT_A ||
                                    pc_tree->partitioning == PARTITION_VERT_B ||
                                    pc_tree->partitioning == PARTITION_SPLIT ||
                                    pc_tree->partitioning == PARTITION_NONE);
  }

  // Pruning: pruning out some 4-way partitions using a DNN taking rd costs of
  // sub-blocks from basic partition types.
  if (cpi->sf.part_sf.ml_prune_partition && partition4_allowed &&
      part_search_state->partition_rect_allowed[HORZ] &&
      part_search_state->partition_rect_allowed[VERT]) {
    av1_ml_prune_4_partition(cpi, x, pc_tree->partitioning, best_rdc->rdcost,
                             part_search_state, part4_search_allowed,
                             pb_source_variance);
  }

  // Pruning: pruning out 4-way partitions based on the number of horz/vert wins
  // in the current block and sub-blocks in PARTITION_SPLIT.
  prune_4_partition_using_split_info(cpi, x, part_search_state,
                                     part4_search_allowed);
}